

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsdeviceintegration.cpp
# Opt level: O2

int __thiscall QEglFSDeviceIntegration::framebufferIndex(QEglFSDeviceIntegration *this)

{
  long lVar1;
  Data *pDVar2;
  char cVar3;
  int iVar4;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  Data *local_70;
  QRegularExpressionMatch match;
  QFileInfo fbinfo;
  QArrayDataPointer<char16_t> local_48;
  QRegularExpression fbIndexRx;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _fbIndexRx = &DAT_aaaaaaaaaaaaaaaa;
  latin1.m_data = "fb(\\d+)";
  latin1.m_size = 7;
  QString::QString((QString *)&local_48,latin1);
  QRegularExpression::QRegularExpression(&fbIndexRx,&local_48,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  _fbinfo = &DAT_aaaaaaaaaaaaaaaa;
  (*this->_vptr_QEglFSDeviceIntegration[0x1d])((QArrayDataPointer<char> *)&match,this);
  QString::fromLocal8Bit<void>((QString *)&local_48,(QByteArray *)&match);
  QFileInfo::QFileInfo(&fbinfo,(QString *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&match);
  _match = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QRegularExpressionMatch::QRegularExpressionMatch(&match);
  cVar3 = QFileInfo::isSymLink();
  if (cVar3 == '\0') {
    QFileInfo::fileName();
  }
  else {
    QFileInfo::symLinkTarget();
  }
  QRegularExpression::match((QRegularExpressionMatch *)&local_70,&fbIndexRx,&local_48,0,0,0);
  pDVar2 = _match;
  _match = local_70;
  local_70 = pDVar2;
  QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  cVar3 = QRegularExpressionMatch::hasMatch();
  iVar4 = 0;
  if (cVar3 != '\0') {
    QRegularExpressionMatch::captured((int)&local_48);
    iVar4 = QString::toInt((QString *)&local_48,(bool *)0x0,10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  QRegularExpressionMatch::~QRegularExpressionMatch(&match);
  QFileInfo::~QFileInfo(&fbinfo);
  QRegularExpression::~QRegularExpression(&fbIndexRx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int QEglFSDeviceIntegration::framebufferIndex() const
{
    int fbIndex = 0;
#if QT_CONFIG(regularexpression)
    QRegularExpression fbIndexRx("fb(\\d+)"_L1);
    QFileInfo fbinfo(QString::fromLocal8Bit(fbDeviceName()));
    QRegularExpressionMatch match;
    if (fbinfo.isSymLink())
        match = fbIndexRx.match(fbinfo.symLinkTarget());
    else
        match = fbIndexRx.match(fbinfo.fileName());
    if (match.hasMatch())
        fbIndex = match.captured(1).toInt();
#endif
    return fbIndex;
}